

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusFrontMostActiveWindow(ImGuiWindow *ignore_window)

{
  ImGuiContext *pIVar1;
  value_type *ppIVar2;
  ImGuiWindow *window;
  ImGuiWindow *focus_window;
  int i;
  ImGuiContext *g;
  ImGuiWindow *ignore_window_local;
  
  pIVar1 = GImGui;
  focus_window._4_4_ = (GImGui->Windows).Size;
  do {
    focus_window._4_4_ = focus_window._4_4_ + -1;
    if (focus_window._4_4_ < 0) {
      return;
    }
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,focus_window._4_4_);
  } while (((*ppIVar2 == ignore_window) ||
           (ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,focus_window._4_4_),
           ((*ppIVar2)->WasActive & 1U) == 0)) ||
          (ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,focus_window._4_4_),
          ((*ppIVar2)->Flags & 0x1000000U) != 0));
  ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,focus_window._4_4_);
  window = NavRestoreLastChildNavWindow(*ppIVar2);
  FocusWindow(window);
  return;
}

Assistant:

void ImGui::FocusFrontMostActiveWindow(ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.Windows.Size - 1; i >= 0; i--)
        if (g.Windows[i] != ignore_window && g.Windows[i]->WasActive && !(g.Windows[i]->Flags & ImGuiWindowFlags_ChildWindow))
        {
            ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(g.Windows[i]); 
            FocusWindow(focus_window);
            return;
        }
}